

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O1

bool __thiscall
Fossilize::ExternalReplayer::Impl::poll_memory_usage
          (Impl *this,uint32_t *num_processes,ProcessStats *stats)

{
  uint uVar1;
  uint uVar2;
  SharedControlBlock *pSVar3;
  uint uVar4;
  long lVar5;
  uint32_t uVar6;
  
  uVar1 = (this->shm_block->num_processes_memory_stats).super___atomic_base<unsigned_int>._M_i;
  if (stats == (ProcessStats *)0x0) {
    *num_processes = uVar1;
  }
  else {
    uVar2 = *num_processes;
    uVar4 = uVar2;
    if ((uVar1 <= uVar2) && (uVar4 = uVar1, uVar1 < uVar2)) {
      *num_processes = uVar1;
    }
    if (uVar4 != 0) {
      pSVar3 = this->shm_block;
      lVar5 = 0;
      do {
        (&stats->resident_mib)[lVar5] =
             *(uint32_t *)
              ((long)&pSVar3->process_reserved_memory_mib[0].super___atomic_base<unsigned_int>._M_i
              + lVar5);
        (&stats->shared_mib)[lVar5] =
             *(uint32_t *)
              ((long)&pSVar3->process_shared_memory_mib[0].super___atomic_base<unsigned_int>._M_i +
              lVar5);
        (&stats->heartbeats)[lVar5] =
             *(int32_t *)
              ((long)&pSVar3->process_heartbeats[0].super___atomic_base<int>._M_i + lVar5);
        uVar6 = 0;
        if (lVar5 != 0) {
          uVar6 = (pSVar3->metadata_shared_size_mib).super___atomic_base<unsigned_int>._M_i;
        }
        (&stats->shared_metadata_mib)[lVar5] = uVar6;
        lVar5 = lVar5 + 4;
      } while ((ulong)uVar4 << 2 != lVar5);
    }
  }
  return true;
}

Assistant:

bool ExternalReplayer::Impl::poll_memory_usage(uint32_t *num_processes, ProcessStats *stats) const
{
	uint32_t active_children = shm_block->num_processes_memory_stats.load(std::memory_order_acquire);

	if (stats)
	{
		if (active_children > *num_processes)
			active_children = *num_processes;
		else if (active_children < *num_processes)
			*num_processes = active_children;

		for (uint32_t i = 0; i < active_children; i++)
		{
			stats[i].resident_mib = shm_block->process_reserved_memory_mib[i].load(std::memory_order_relaxed);
			stats[i].shared_mib = shm_block->process_shared_memory_mib[i].load(std::memory_order_relaxed);
			stats[i].heartbeats = shm_block->process_heartbeats[i].load(std::memory_order_relaxed);

			if (i != 0)
				stats[i].shared_metadata_mib = shm_block->metadata_shared_size_mib.load(std::memory_order_relaxed);
			else
				stats[i].shared_metadata_mib = 0;
		}
	}
	else
		*num_processes = active_children;

	return true;
}